

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_trs.cc
# Opt level: O3

int obj_trust(int id,X509 *x)

{
  int iVar1;
  size_t sVar2;
  ASN1_OBJECT *pAVar3;
  size_t sVar4;
  
  if (x != (X509 *)0x0) {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)x->sig_alg);
    if (sVar2 != 0) {
      sVar2 = 0;
      do {
        pAVar3 = (ASN1_OBJECT *)OPENSSL_sk_value((OPENSSL_STACK *)x->sig_alg,sVar2);
        iVar1 = OBJ_obj2nid(pAVar3);
        if (iVar1 == id) {
          return 2;
        }
        sVar2 = sVar2 + 1;
        sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)x->sig_alg);
      } while (sVar2 < sVar4);
    }
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)x->cert_info);
    if (sVar2 != 0) {
      sVar2 = 0;
      do {
        pAVar3 = (ASN1_OBJECT *)OPENSSL_sk_value((OPENSSL_STACK *)x->cert_info,sVar2);
        iVar1 = OBJ_obj2nid(pAVar3);
        if (iVar1 == id) {
          return 1;
        }
        sVar2 = sVar2 + 1;
        sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)x->cert_info);
      } while (sVar2 < sVar4);
    }
  }
  return 3;
}

Assistant:

static int obj_trust(int id, X509 *x) {
  X509_CERT_AUX *ax = x->aux;
  if (!ax) {
    return X509_TRUST_UNTRUSTED;
  }
  for (size_t i = 0; i < sk_ASN1_OBJECT_num(ax->reject); i++) {
    const ASN1_OBJECT *obj = sk_ASN1_OBJECT_value(ax->reject, i);
    if (OBJ_obj2nid(obj) == id) {
      return X509_TRUST_REJECTED;
    }
  }
  for (size_t i = 0; i < sk_ASN1_OBJECT_num(ax->trust); i++) {
    const ASN1_OBJECT *obj = sk_ASN1_OBJECT_value(ax->trust, i);
    if (OBJ_obj2nid(obj) == id) {
      return X509_TRUST_TRUSTED;
    }
  }
  return X509_TRUST_UNTRUSTED;
}